

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O1

void bt_skip_func(uint32_t len_limit,uint32_t pos,uint8_t *cur,uint32_t cur_match,uint32_t depth,
                 uint32_t *son,uint32_t cyclic_pos,uint32_t cyclic_size)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uint32_t *puVar5;
  uint32_t *puVar6;
  uint32_t *puVar7;
  ulong uVar8;
  uint32_t uVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  uint local_40;
  
  puVar5 = son + cyclic_pos * 2;
  local_40 = 0;
  uVar11 = 0;
  puVar6 = son + (ulong)(cyclic_pos * 2) + 1;
  do {
    bVar12 = depth == 0;
    depth = depth - 1;
    if ((bVar12) || (uVar2 = pos - cur_match, cyclic_size <= uVar2)) {
      bVar12 = false;
      *puVar6 = 0;
      *puVar5 = 0;
      puVar7 = puVar6;
    }
    else {
      uVar9 = 0;
      if (cyclic_pos < uVar2) {
        uVar9 = cyclic_size;
      }
      uVar8 = (ulong)(((cyclic_pos - uVar2) + uVar9) * 2);
      uVar10 = uVar11;
      if (local_40 < uVar11) {
        uVar10 = local_40;
      }
      uVar3 = (ulong)uVar10;
      puVar7 = son + uVar8;
      if (cur[uVar3 - uVar2] == cur[uVar3]) {
        uVar10 = uVar10 + 1;
        if (len_limit < uVar10) {
          __assert_fail("len <= limit",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                        ,0x2e,
                        "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                       );
        }
        if ((int)len_limit < 0) {
          __assert_fail("limit <= UINT32_MAX / 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                        ,0x2f,
                        "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                       );
        }
        do {
          if (len_limit <= uVar10) {
            uVar8 = (ulong)len_limit;
            break;
          }
          uVar3 = (ulong)uVar10;
          uVar4 = *(long *)(cur + (uVar3 - uVar2)) - *(long *)(cur + uVar3);
          if (uVar4 == 0) {
            uVar10 = uVar10 + 8;
          }
          else {
            uVar8 = 0;
            if (uVar4 != 0) {
              for (; (uVar4 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
              }
            }
            uVar10 = ((uint)(uVar8 >> 3) & 0x1fffffff) + uVar10;
            uVar1 = len_limit;
            if (uVar10 < len_limit) {
              uVar1 = uVar10;
            }
            uVar8 = (ulong)uVar1;
          }
        } while (*(long *)(cur + (uVar3 - uVar2)) == *(long *)(cur + uVar3));
        uVar3 = uVar8;
        if ((uint32_t)uVar8 == len_limit) {
          *puVar5 = *puVar7;
          *puVar6 = puVar7[1];
          bVar12 = false;
          puVar7 = puVar6;
          goto LAB_0044eb91;
        }
      }
      if (cur[uVar3 - uVar2] < cur[uVar3]) {
        *puVar5 = cur_match;
        puVar5 = puVar7 + 1;
        puVar7 = puVar6;
        puVar6 = puVar5;
        uVar11 = (uint)uVar3;
      }
      else {
        *puVar6 = cur_match;
        puVar6 = puVar7;
        local_40 = (uint)uVar3;
      }
      cur_match = *puVar6;
      bVar12 = true;
    }
LAB_0044eb91:
    puVar6 = puVar7;
    if (!bVar12) {
      return;
    }
  } while( true );
}

Assistant:

static void
bt_skip_func(
		const uint32_t len_limit,
		const uint32_t pos,
		const uint8_t *const cur,
		uint32_t cur_match,
		uint32_t depth,
		uint32_t *const son,
		const uint32_t cyclic_pos,
		const uint32_t cyclic_size)
{
	uint32_t *ptr0 = son + (cyclic_pos << 1) + 1;
	uint32_t *ptr1 = son + (cyclic_pos << 1);

	uint32_t len0 = 0;
	uint32_t len1 = 0;

	while (true) {
		const uint32_t delta = pos - cur_match;
		if (depth-- == 0 || delta >= cyclic_size) {
			*ptr0 = EMPTY_HASH_VALUE;
			*ptr1 = EMPTY_HASH_VALUE;
			return;
		}

		uint32_t *pair = son + ((cyclic_pos - delta
				+ (delta > cyclic_pos ? cyclic_size : 0))
				<< 1);
		const uint8_t *pb = cur - delta;
		uint32_t len = my_min(len0, len1);

		if (pb[len] == cur[len]) {
			len = lzma_memcmplen(pb, cur, len + 1, len_limit);

			if (len == len_limit) {
				*ptr1 = pair[0];
				*ptr0 = pair[1];
				return;
			}
		}

		if (pb[len] < cur[len]) {
			*ptr1 = cur_match;
			ptr1 = pair + 1;
			cur_match = *ptr1;
			len1 = len;
		} else {
			*ptr0 = cur_match;
			ptr0 = pair;
			cur_match = *ptr0;
			len0 = len;
		}
	}
}